

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_bytes.cpp
# Opt level: O3

void __thiscall
duckdb::FormatBytesFunction<1024l>
          (duckdb *this,DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  anon_union_16_2_67f50693_for_value *paVar1;
  long *plVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  sel_t *psVar6;
  pointer this_00;
  byte bVar7;
  pointer pLVar8;
  pointer pLVar9;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  idx_t iVar12;
  ExpressionState *extraout_RDX;
  ExpressionState *extraout_RDX_00;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> _Var13;
  ExpressionState *extraout_RDX_01;
  idx_t idx;
  pointer puVar14;
  ulong uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  pointer puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  idx_t iVar21;
  string_t sVar22;
  anon_struct_16_3_d7536bce_for_pointer aVar23;
  pointer local_98;
  pointer pLStack_90;
  data_ptr_t local_88;
  pointer local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this,0);
  count = *(idx_t *)(this + 0x18);
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType((Vector *)state,FLAT_VECTOR);
    puVar17 = (state->child_states).
              super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pdVar4 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector((Vector *)state);
    puVar14 = (pointer)(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar14 == (pointer)0x0) {
      if (count != 0) {
        puVar17 = puVar17 + 1;
        iVar21 = 0;
        _Var13._M_head_impl = extraout_RDX;
        do {
          sVar22 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(pdVar4 + iVar21 * 8),(ValidityMask *)state,
                              (idx_t)_Var13._M_head_impl,result);
          _Var13._M_head_impl = sVar22.value._8_8_;
          puVar17[-1].
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar22.value._0_8_
          ;
          (puVar17->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
               _Var13._M_head_impl;
          iVar21 = iVar21 + 1;
          puVar17 = puVar17 + 2;
        } while (count != iVar21);
      }
    }
    else {
      (state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar14;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)&state->types,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        uVar15 = 0;
        _Var13._M_head_impl = extraout_RDX_00;
        uVar16 = 0;
        do {
          puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar19 = uVar16 + 0x40;
            if (count <= uVar16 + 0x40) {
              uVar19 = count;
            }
LAB_01c3f946:
            uVar20 = uVar16;
            if (uVar16 < uVar19) {
              puVar14 = puVar17 + uVar16 * 2 + 1;
              do {
                sVar22 = UnaryLambdaWrapper::
                         Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                   (*(long *)(pdVar4 + uVar16 * 8),(ValidityMask *)state,
                                    (idx_t)_Var13._M_head_impl,result);
                _Var13._M_head_impl = sVar22.value._8_8_;
                puVar14[-1].
                super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                     sVar22.value._0_8_;
                (puVar14->
                super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                     _Var13._M_head_impl;
                uVar16 = uVar16 + 1;
                puVar14 = puVar14 + 2;
                uVar20 = uVar19;
              } while (uVar19 != uVar16);
            }
          }
          else {
            uVar5 = puVar3[uVar15];
            uVar19 = uVar16 + 0x40;
            if (count <= uVar16 + 0x40) {
              uVar19 = count;
            }
            uVar20 = uVar19;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_01c3f946;
              uVar20 = uVar16;
              if (uVar16 < uVar19) {
                local_88 = pdVar4 + uVar16 * 8;
                puVar14 = puVar17 + uVar16 * 2 + 1;
                uVar18 = 0;
                do {
                  if ((uVar5 >> (uVar18 & 0x3f) & 1) != 0) {
                    sVar22 = UnaryLambdaWrapper::
                             Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                       (*(long *)(local_88 + uVar18 * 8),(ValidityMask *)state,
                                        (idx_t)_Var13._M_head_impl,result);
                    _Var13._M_head_impl = sVar22.value._8_8_;
                    puVar14[-1].
                    super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                    .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                         sVar22.value._0_8_;
                    (puVar14->
                    super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                    .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                         _Var13._M_head_impl;
                  }
                  uVar18 = uVar18 + 1;
                  puVar14 = puVar14 + 2;
                  uVar20 = uVar19;
                } while (uVar19 - uVar16 != uVar18);
              }
            }
          }
          uVar15 = uVar15 + 1;
          uVar16 = uVar20;
        } while (uVar15 != count + 0x3f >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType((Vector *)state,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)
             (state->child_states).
             super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    plVar2 = (long *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull((Vector *)state,true);
      return;
    }
    ConstantVector::SetNull((Vector *)state,false);
    aVar23 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                       (*plVar2,(ValidityMask *)state,idx,result);
    paVar1->pointer = aVar23;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType((Vector *)state,FLAT_VECTOR);
    puVar17 = (state->child_states).
              super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    FlatVector::VerifyFlatVector((Vector *)state);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar6 = (local_78.sel)->sel_vector;
        puVar17 = puVar17 + 1;
        iVar21 = 0;
        _Var13._M_head_impl = extraout_RDX_01;
        do {
          iVar12 = iVar21;
          if (psVar6 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar6[iVar21];
          }
          sVar22 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_78.data + iVar12 * 8),(ValidityMask *)state,
                              (idx_t)_Var13._M_head_impl,result);
          _Var13._M_head_impl = sVar22.value._8_8_;
          puVar17[-1].
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar22.value._0_8_
          ;
          (puVar17->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
               _Var13._M_head_impl;
          iVar21 = iVar21 + 1;
          puVar17 = puVar17 + 2;
        } while (count != iVar21);
      }
    }
    else if (count != 0) {
      psVar6 = (local_78.sel)->sel_vector;
      puVar17 = puVar17 + 1;
      uVar16 = 0;
      do {
        uVar15 = uVar16;
        if (psVar6 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar6[uVar16];
        }
        if (((ulong)local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
          _Var11._M_head_impl =
               (unsigned_long *)
               (state->child_states).
               super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((pointer)_Var11._M_head_impl == (pointer)0x0) {
            local_80 = (state->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,(unsigned_long *)&local_80);
            pLVar9 = pLStack_90;
            pLVar8 = local_98;
            local_98 = (pointer)0x0;
            pLStack_90 = (pointer)0x0;
            this_00 = (state->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            (state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start = pLVar8;
            (state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish = pLVar9;
            if ((this_00 != (pointer)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
               pLStack_90 != (pointer)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_90);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 &state->types);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (state->child_states).
            super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Var11._M_head_impl;
          }
          bVar7 = (byte)uVar16 & 0x3f;
          _Var11._M_head_impl[uVar16 >> 6] =
               _Var11._M_head_impl[uVar16 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        else {
          sVar22 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_78.data + uVar15 * 8),(ValidityMask *)state,
                              uVar15 >> 6,
                              (void *)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                      validity_mask[uVar15 >> 6]);
          puVar17[-1].
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar22.value._0_8_
          ;
          (puVar17->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar22.value._8_8_
          ;
        }
        uVar16 = uVar16 + 1;
        puVar17 = puVar17 + 2;
      } while (count != uVar16);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void FormatBytesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<int64_t, string_t>(args.data[0], result, args.size(), [&](int64_t bytes) {
		bool is_negative = bytes < 0;
		idx_t unsigned_bytes;
		if (bytes < 0) {
			if (bytes == NumericLimits<int64_t>::Minimum()) {
				unsigned_bytes = idx_t(NumericLimits<int64_t>::Maximum()) + 1;
			} else {
				unsigned_bytes = idx_t(-bytes);
			}
		} else {
			unsigned_bytes = idx_t(bytes);
		}
		return StringVector::AddString(result, (is_negative ? "-" : "") +
		                                           StringUtil::BytesToHumanReadableString(unsigned_bytes, MULTIPLIER));
	});
}